

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  _func_int *p_Var9;
  size_t sVar10;
  void *pvVar11;
  _func_int **pp_Var12;
  undefined1 auVar13 [16];
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  undefined1 (*pauVar30) [16];
  int iVar31;
  ulong uVar32;
  float *pfVar33;
  int j;
  ulong uVar34;
  int iVar35;
  float *pfVar36;
  int iVar37;
  ulong uVar38;
  int j_1;
  long lVar39;
  bool bVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 extraout_var [12];
  float fVar53;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  float fVar68;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 local_138 [8];
  undefined8 uStack_130;
  int local_e0;
  Mat bottom_blob_bordered;
  Mat local_78;
  
  uVar38 = bottom_blob->elemsize;
  iVar7 = bottom_blob->elempack;
  p_Var9 = this->_vptr_Convolution1D_x86[-3];
  iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var9);
  iVar31 = *(int *)(&this->field_0xd8 + (long)p_Var9);
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86 + (long)p_Var9),bottom_blob,
             &bottom_blob_bordered,opt);
  iVar26 = bottom_blob_bordered.h;
  local_e0 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    bVar29 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) & 3) == 0 &
             opt->use_packing_layout;
    iVar35 = (uint)bVar29 + (uint)bVar29 * 2 + 1;
    iVar8 = (~((iVar8 + -1) * iVar31) + bottom_blob_bordered.w) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]);
    uVar28 = (long)(int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) /
             (long)iVar35;
    uVar27 = uVar28 & 0xffffffff;
    iVar31 = (int)uVar28;
    Mat::create(top_blob,iVar8 + 1,iVar31,uVar38 / (ulong)(long)iVar7 << bVar29 * '\x02',iVar35,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar29 = bVar29 ^ 1;
      if (iVar7 == 4 && bVar29 == 0) {
        uVar38 = 0;
        if (0 < iVar26) {
          uVar38 = (ulong)(uint)iVar26;
        }
        uVar28 = 0;
        if (0 < iVar31) {
          uVar28 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar28; uVar32 = uVar32 + 1) {
          pauVar30 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar8; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86[-3]) == 0) {
              local_138 = (undefined1  [8])0x0;
              uStack_130 = 0;
            }
            else {
              puVar4 = (undefined8 *)
                       (*(long *)(&this->field_0x190 + (long)this->_vptr_Convolution1D_x86[-3]) +
                       uVar32 * 0x10);
              local_138 = (undefined1  [8])*puVar4;
              uStack_130 = puVar4[1];
            }
            Mat::channel(&local_78,&this->weight_data_packed,(int)uVar32);
            pfVar33 = (float *)local_78.data;
            Mat::~Mat(&local_78);
            for (uVar34 = 0; uVar34 != uVar38; uVar34 = uVar34 + 1) {
              p_Var9 = this->_vptr_Convolution1D_x86[-3];
              pfVar36 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar35 * 4) * 4
                                 + (long)bottom_blob_bordered.w *
                                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                            (undefined4)bottom_blob_bordered.elemsize) * uVar34);
              iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var9);
              if (*(int *)(&this->field_0xd4 + (long)p_Var9) < 1) {
                iVar37 = 0;
              }
              while (bVar40 = iVar37 != 0, iVar37 = iVar37 + -1, bVar40) {
                fVar67 = *pfVar36;
                fVar75 = pfVar36[1];
                fVar77 = pfVar36[2];
                fVar79 = pfVar36[3];
                fVar53 = *pfVar33;
                pfVar14 = pfVar33 + 1;
                pfVar15 = pfVar33 + 2;
                pfVar16 = pfVar33 + 3;
                pfVar1 = pfVar33 + 4;
                pfVar17 = pfVar33 + 5;
                pfVar18 = pfVar33 + 6;
                pfVar19 = pfVar33 + 7;
                pfVar2 = pfVar33 + 8;
                pfVar20 = pfVar33 + 9;
                pfVar21 = pfVar33 + 10;
                pfVar22 = pfVar33 + 0xb;
                pfVar3 = pfVar33 + 0xc;
                pfVar23 = pfVar33 + 0xd;
                pfVar24 = pfVar33 + 0xe;
                pfVar25 = pfVar33 + 0xf;
                pfVar36 = pfVar36 + (long)*(int *)(&this->field_0xd8 + (long)p_Var9) * 4;
                pfVar33 = pfVar33 + 0x10;
                local_138._4_4_ =
                     *pfVar14 * fVar67 + (float)local_138._4_4_ +
                     *pfVar20 * fVar77 + *pfVar17 * fVar75 + *pfVar23 * fVar79;
                local_138._0_4_ =
                     fVar53 * fVar67 + (float)local_138._0_4_ + *pfVar2 * fVar77 + *pfVar1 * fVar75
                     + *pfVar3 * fVar79;
                uStack_130._0_4_ =
                     *pfVar15 * fVar67 + (float)uStack_130 + *pfVar21 * fVar77 + *pfVar18 * fVar75 +
                     *pfVar24 * fVar79;
                uStack_130._4_4_ =
                     *pfVar16 * fVar67 + uStack_130._4_4_ + *pfVar22 * fVar77 + *pfVar19 * fVar75 +
                     *pfVar25 * fVar79;
              }
            }
            p_Var9 = this->_vptr_Convolution1D_x86[-3];
            auVar42 = _local_138;
            if (*(int *)(&this->field_0xf4 + (long)p_Var9) - 1U < 6) {
              fVar67 = local_138._0_4_;
              fVar75 = local_138._4_4_;
              fVar77 = local_138._8_4_;
              fVar79 = local_138._12_4_;
              auVar42 = maxps(_local_138,ZEXT816(0));
              switch(*(int *)(&this->field_0xf4 + (long)p_Var9)) {
              case 2:
                auVar46 = minps(_local_138,ZEXT816(0));
                fVar67 = **(float **)(&this->field_0xf8 + (long)p_Var9);
                auVar43._0_4_ = auVar42._0_4_ + fVar67 * auVar46._0_4_;
                auVar43._4_4_ = auVar42._4_4_ + fVar67 * auVar46._4_4_;
                auVar43._8_4_ = auVar42._8_4_ + fVar67 * auVar46._8_4_;
                auVar43._12_4_ = auVar42._12_4_ + fVar67 * auVar46._12_4_;
                auVar42 = auVar43;
                break;
              case 3:
                uVar5 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var9);
                uVar6 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var9))[1];
                auVar45._4_4_ = uVar5;
                auVar45._0_4_ = uVar5;
                auVar45._8_4_ = uVar5;
                auVar45._12_4_ = uVar5;
                auVar57._4_4_ = uVar6;
                auVar57._0_4_ = uVar6;
                auVar57._8_4_ = uVar6;
                auVar57._12_4_ = uVar6;
                auVar42 = maxps(_local_138,auVar45);
                auVar42 = minps(auVar42,auVar57);
                break;
              case 4:
                auVar70._0_8_ = local_138 ^ 0x8000000080000000;
                auVar70._8_4_ = -fVar77;
                auVar70._12_4_ = -fVar79;
                auVar42 = minps(auVar70,_DAT_002da3c0);
                auVar42 = maxps(auVar42,_DAT_002da3d0);
                fVar75 = auVar42._0_4_ * 1.442695 + 0.5;
                fVar79 = auVar42._4_4_ * 1.442695 + 0.5;
                fVar64 = auVar42._8_4_ * 1.442695 + 0.5;
                fVar66 = auVar42._12_4_ * 1.442695 + 0.5;
                fVar67 = (float)(int)fVar75;
                fVar77 = (float)(int)fVar79;
                fVar53 = (float)(int)fVar64;
                fVar65 = (float)(int)fVar66;
                fVar67 = fVar67 - (float)(-(uint)(fVar75 < fVar67) & 0x3f800000);
                fVar77 = fVar77 - (float)(-(uint)(fVar79 < fVar77) & 0x3f800000);
                fVar53 = fVar53 - (float)(-(uint)(fVar64 < fVar53) & 0x3f800000);
                fVar65 = fVar65 - (float)(-(uint)(fVar66 < fVar65) & 0x3f800000);
                fVar75 = fVar67 * -0.6931472 + auVar42._0_4_;
                fVar79 = fVar77 * -0.6931472 + auVar42._4_4_;
                fVar64 = fVar53 * -0.6931472 + auVar42._8_4_;
                fVar66 = fVar65 * -0.6931472 + auVar42._12_4_;
                auVar71._0_4_ = fVar75 * fVar75;
                auVar71._4_4_ = fVar79 * fVar79;
                auVar71._8_4_ = fVar64 * fVar64;
                auVar71._12_4_ = fVar66 * fVar66;
                auVar58._0_4_ =
                     (float)((int)fVar67 * 0x800000 + 0x3f800000) *
                     (fVar75 + 1.0 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * auVar71._0_4_) + 1.0;
                auVar58._4_4_ =
                     (float)((int)fVar77 * 0x800000 + 0x3f800000) *
                     (fVar79 + 1.0 +
                     (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                       0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * auVar71._4_4_) + 1.0;
                auVar58._8_4_ =
                     (float)((int)fVar53 * 0x800000 + 0x3f800000) *
                     (fVar64 + 1.0 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * auVar71._8_4_) + 1.0;
                auVar58._12_4_ =
                     (float)((int)fVar65 * 0x800000 + 0x3f800000) *
                     (fVar66 + 1.0 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * auVar71._12_4_) + 1.0;
                auVar42 = rcpps(auVar71,auVar58);
                fVar67 = auVar42._0_4_;
                fVar75 = auVar42._4_4_;
                fVar77 = auVar42._8_4_;
                fVar79 = auVar42._12_4_;
                auVar42._0_4_ = (1.0 - auVar58._0_4_ * fVar67) * fVar67 + fVar67;
                auVar42._4_4_ = (1.0 - auVar58._4_4_ * fVar75) * fVar75 + fVar75;
                auVar42._8_4_ = (1.0 - auVar58._8_4_ * fVar77) * fVar77 + fVar77;
                auVar42._12_4_ = (1.0 - auVar58._12_4_ * fVar79) * fVar79 + fVar79;
                break;
              case 5:
                auVar42 = minps(_local_138,_DAT_002da3c0);
                auVar42 = maxps(auVar42,_DAT_002da3d0);
                fVar53 = auVar42._0_4_ * 1.442695 + 0.5;
                fVar64 = auVar42._4_4_ * 1.442695 + 0.5;
                fVar65 = auVar42._8_4_ * 1.442695 + 0.5;
                fVar66 = auVar42._12_4_ * 1.442695 + 0.5;
                fVar68 = (float)(int)fVar53;
                fVar76 = (float)(int)fVar64;
                fVar78 = (float)(int)fVar65;
                fVar80 = (float)(int)fVar66;
                fVar68 = fVar68 - (float)(-(uint)(fVar53 < fVar68) & 0x3f800000);
                fVar76 = fVar76 - (float)(-(uint)(fVar64 < fVar76) & 0x3f800000);
                fVar78 = fVar78 - (float)(-(uint)(fVar65 < fVar78) & 0x3f800000);
                fVar80 = fVar80 - (float)(-(uint)(fVar66 < fVar80) & 0x3f800000);
                fVar53 = auVar42._0_4_ - fVar68 * 0.6931472;
                fVar64 = auVar42._4_4_ - fVar76 * 0.6931472;
                fVar65 = auVar42._8_4_ - fVar78 * 0.6931472;
                fVar66 = auVar42._12_4_ - fVar80 * 0.6931472;
                auVar54._0_4_ =
                     (float)((int)fVar68 * 0x800000 + 0x3f800000) *
                     (fVar53 + 1.0 +
                     (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                       0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) * fVar53 * fVar53) + 1.0;
                auVar54._4_4_ =
                     (float)((int)fVar76 * 0x800000 + 0x3f800000) *
                     (fVar64 + 1.0 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64) + 1.0;
                auVar54._8_4_ =
                     (float)((int)fVar78 * 0x800000 + 0x3f800000) *
                     (fVar65 + 1.0 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65) + 1.0;
                auVar54._12_4_ =
                     (float)((int)fVar80 * 0x800000 + 0x3f800000) *
                     (fVar66 + 1.0 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) + 1.0;
                auVar42 = maxps(auVar54,_DAT_002da460);
                fVar53 = (float)(auVar42._0_4_ & 0x807fffff | 0x3f000000);
                fVar65 = (float)(auVar42._4_4_ & 0x807fffff | 0x3f000000);
                fVar68 = (float)(auVar42._8_4_ & 0x807fffff | 0x3f000000);
                fVar78 = (float)(auVar42._12_4_ & 0x807fffff | 0x3f000000);
                fVar64 = fVar53 + -1.0 + (float)(-(uint)(fVar53 < 0.70710677) & (uint)fVar53);
                fVar66 = fVar65 + -1.0 + (float)(-(uint)(fVar65 < 0.70710677) & (uint)fVar65);
                fVar76 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
                fVar80 = fVar78 + -1.0 + (float)(-(uint)(fVar78 < 0.70710677) & (uint)fVar78);
                auVar55._0_4_ =
                     ~-(uint)(auVar54._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar53 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar64 + (((((((((fVar64 * 0.070376836 + -0.1151461) * fVar64 +
                                             0.116769984) * fVar64 + -0.12420141) * fVar64 +
                                           0.14249323) * fVar64 + -0.16668057) * fVar64 + 0.20000714
                                         ) * fVar64 + -0.24999994) * fVar64 + 0.3333333) * fVar64 +
                                      -0.5) * fVar64 * fVar64) * -2.0);
                auVar55._4_4_ =
                     ~-(uint)(auVar54._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar65 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar66 + (((((((((fVar66 * 0.070376836 + -0.1151461) * fVar66 +
                                             0.116769984) * fVar66 + -0.12420141) * fVar66 +
                                           0.14249323) * fVar66 + -0.16668057) * fVar66 + 0.20000714
                                         ) * fVar66 + -0.24999994) * fVar66 + 0.3333333) * fVar66 +
                                      -0.5) * fVar66 * fVar66) * -2.0);
                auVar55._8_4_ =
                     ~-(uint)(auVar54._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar68 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar76 + (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 +
                                             0.116769984) * fVar76 + -0.12420141) * fVar76 +
                                           0.14249323) * fVar76 + -0.16668057) * fVar76 + 0.20000714
                                         ) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 +
                                      -0.5) * fVar76 * fVar76) * -2.0);
                auVar55._12_4_ =
                     ~-(uint)(auVar54._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar78 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar80 + (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                             0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                           0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714
                                         ) * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 +
                                      -0.5) * fVar80 * fVar80) * -2.0);
                auVar44._0_8_ =
                     CONCAT44(-(uint)(auVar54._4_4_ <= 0.0),-(uint)(auVar54._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar44._8_4_ = -(uint)(auVar54._8_4_ <= 0.0) & 0x7fffffff;
                auVar44._12_4_ = -(uint)(auVar54._12_4_ <= 0.0) & 0x7fffffff;
                auVar42 = minps(auVar44 | auVar55,_DAT_002da3c0);
                auVar42 = maxps(auVar42,_DAT_002da3d0);
                fVar53 = auVar42._0_4_ * 1.442695 + 0.5;
                fVar64 = auVar42._4_4_ * 1.442695 + 0.5;
                fVar65 = auVar42._8_4_ * 1.442695 + 0.5;
                fVar66 = auVar42._12_4_ * 1.442695 + 0.5;
                fVar68 = (float)(int)fVar53;
                fVar76 = (float)(int)fVar64;
                fVar78 = (float)(int)fVar65;
                fVar80 = (float)(int)fVar66;
                fVar68 = fVar68 - (float)(-(uint)(fVar53 < fVar68) & 0x3f800000);
                fVar76 = fVar76 - (float)(-(uint)(fVar64 < fVar76) & 0x3f800000);
                fVar78 = fVar78 - (float)(-(uint)(fVar65 < fVar78) & 0x3f800000);
                fVar80 = fVar80 - (float)(-(uint)(fVar66 < fVar80) & 0x3f800000);
                fVar53 = auVar42._0_4_ - fVar68 * 0.6931472;
                fVar64 = auVar42._4_4_ - fVar76 * 0.6931472;
                fVar65 = auVar42._8_4_ - fVar78 * 0.6931472;
                fVar66 = auVar42._12_4_ - fVar80 * 0.6931472;
                auVar56._0_4_ = fVar53 * fVar53;
                auVar56._4_4_ = fVar64 * fVar64;
                auVar56._8_4_ = fVar65 * fVar65;
                auVar56._12_4_ = fVar66 * fVar66;
                auVar69._0_4_ =
                     (float)((int)fVar68 * 0x800000 + 0x3f800000) *
                     (fVar53 + 1.0 +
                     (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                       0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) * auVar56._0_4_) + 1.0;
                auVar69._4_4_ =
                     (float)((int)fVar76 * 0x800000 + 0x3f800000) *
                     (fVar64 + 1.0 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * auVar56._4_4_) + 1.0;
                auVar69._8_4_ =
                     (float)((int)fVar78 * 0x800000 + 0x3f800000) *
                     (fVar65 + 1.0 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * auVar56._8_4_) + 1.0;
                auVar69._12_4_ =
                     (float)((int)fVar80 * 0x800000 + 0x3f800000) *
                     (fVar66 + 1.0 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * auVar56._12_4_) + 1.0;
                auVar42 = rcpps(auVar56,auVar69);
                fVar53 = auVar42._0_4_;
                fVar64 = auVar42._4_4_;
                fVar65 = auVar42._8_4_;
                fVar66 = auVar42._12_4_;
                auVar42._0_4_ =
                     (fVar53 + fVar53 + -1.0 + (2.0 - auVar69._0_4_ * (fVar53 + fVar53)) * fVar53) *
                     fVar67;
                auVar42._4_4_ =
                     (fVar64 + fVar64 + -1.0 + (2.0 - auVar69._4_4_ * (fVar64 + fVar64)) * fVar64) *
                     fVar75;
                auVar42._8_4_ =
                     (fVar65 + fVar65 + -1.0 + (2.0 - auVar69._8_4_ * (fVar65 + fVar65)) * fVar65) *
                     fVar77;
                auVar42._12_4_ =
                     (fVar66 + fVar66 + -1.0 + (2.0 - auVar69._12_4_ * (fVar66 + fVar66)) * fVar66)
                     * fVar79;
                break;
              case 6:
                fVar53 = **(float **)(&this->field_0xf8 + (long)p_Var9);
                fVar64 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
                auVar46._0_4_ = fVar53 * fVar67 + fVar64;
                auVar46._4_4_ = fVar53 * fVar75 + fVar64;
                auVar46._8_4_ = fVar53 * fVar77 + fVar64;
                auVar46._12_4_ = fVar53 * fVar79 + fVar64;
                auVar42 = maxps(auVar46,ZEXT816(0));
                auVar46 = minps(auVar42,_DAT_002da3b0);
                auVar42._0_4_ = auVar46._0_4_ * fVar67;
                auVar42._4_4_ = auVar46._4_4_ * fVar75;
                auVar42._8_4_ = auVar46._8_4_ * fVar77;
                auVar42._12_4_ = auVar46._12_4_ * fVar79;
              }
            }
            *pauVar30 = auVar42;
            pauVar30 = pauVar30 + 1;
          }
        }
      }
      if (iVar7 == 1 && bVar29 == 0) {
        uVar38 = 0;
        if (0 < iVar26) {
          uVar38 = (ulong)(uint)iVar26;
        }
        uVar28 = 0;
        if (0 < iVar31) {
          uVar28 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar28; uVar32 = uVar32 + 1) {
          pauVar30 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar8; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86[-3]) == 0) {
              local_138 = (undefined1  [8])0x0;
              uStack_130 = 0;
            }
            else {
              puVar4 = (undefined8 *)
                       (*(long *)(&this->field_0x190 + (long)this->_vptr_Convolution1D_x86[-3]) +
                       uVar32 * 0x10);
              local_138 = (undefined1  [8])*puVar4;
              uStack_130 = puVar4[1];
            }
            Mat::channel(&local_78,&this->weight_data_packed,(int)uVar32);
            pfVar33 = (float *)local_78.data;
            Mat::~Mat(&local_78);
            for (uVar34 = 0; uVar34 != uVar38; uVar34 = uVar34 + 1) {
              p_Var9 = this->_vptr_Convolution1D_x86[-3];
              pfVar36 = (float *)((long)bottom_blob_bordered.data +
                                 (long)iVar35 * (long)*(int *)(&this->field_0xdc + (long)p_Var9) * 4
                                 + (long)bottom_blob_bordered.w *
                                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                            (undefined4)bottom_blob_bordered.elemsize) * uVar34);
              iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var9);
              if (*(int *)(&this->field_0xd4 + (long)p_Var9) < 1) {
                iVar37 = 0;
              }
              while (bVar40 = iVar37 != 0, iVar37 = iVar37 + -1, bVar40) {
                fVar67 = *pfVar36;
                local_138._4_4_ = (float)local_138._4_4_ + pfVar33[1] * fVar67;
                local_138._0_4_ = (float)local_138._0_4_ + *pfVar33 * fVar67;
                uStack_130._0_4_ = (float)uStack_130 + pfVar33[2] * fVar67;
                uStack_130._4_4_ = uStack_130._4_4_ + pfVar33[3] * fVar67;
                pfVar36 = pfVar36 + *(int *)(&this->field_0xd8 + (long)p_Var9);
                pfVar33 = pfVar33 + 4;
              }
            }
            p_Var9 = this->_vptr_Convolution1D_x86[-3];
            auVar47 = _local_138;
            if (*(int *)(&this->field_0xf4 + (long)p_Var9) - 1U < 6) {
              fVar67 = local_138._0_4_;
              fVar75 = local_138._4_4_;
              fVar77 = local_138._8_4_;
              fVar79 = local_138._12_4_;
              auVar47 = maxps(_local_138,ZEXT816(0));
              switch(*(int *)(&this->field_0xf4 + (long)p_Var9)) {
              case 2:
                auVar42 = minps(_local_138,ZEXT816(0));
                fVar67 = **(float **)(&this->field_0xf8 + (long)p_Var9);
                auVar48._0_4_ = auVar47._0_4_ + fVar67 * auVar42._0_4_;
                auVar48._4_4_ = auVar47._4_4_ + fVar67 * auVar42._4_4_;
                auVar48._8_4_ = auVar47._8_4_ + fVar67 * auVar42._8_4_;
                auVar48._12_4_ = auVar47._12_4_ + fVar67 * auVar42._12_4_;
                auVar47 = auVar48;
                break;
              case 3:
                uVar5 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var9);
                uVar6 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var9))[1];
                auVar50._4_4_ = uVar5;
                auVar50._0_4_ = uVar5;
                auVar50._8_4_ = uVar5;
                auVar50._12_4_ = uVar5;
                auVar62._4_4_ = uVar6;
                auVar62._0_4_ = uVar6;
                auVar62._8_4_ = uVar6;
                auVar62._12_4_ = uVar6;
                auVar42 = maxps(_local_138,auVar50);
                auVar47 = minps(auVar42,auVar62);
                break;
              case 4:
                auVar73._0_8_ = local_138 ^ 0x8000000080000000;
                auVar73._8_4_ = -fVar77;
                auVar73._12_4_ = -fVar79;
                auVar42 = minps(auVar73,_DAT_002da3c0);
                auVar42 = maxps(auVar42,_DAT_002da3d0);
                fVar75 = auVar42._0_4_ * 1.442695 + 0.5;
                fVar79 = auVar42._4_4_ * 1.442695 + 0.5;
                fVar64 = auVar42._8_4_ * 1.442695 + 0.5;
                fVar66 = auVar42._12_4_ * 1.442695 + 0.5;
                fVar67 = (float)(int)fVar75;
                fVar77 = (float)(int)fVar79;
                fVar53 = (float)(int)fVar64;
                fVar65 = (float)(int)fVar66;
                fVar67 = fVar67 - (float)(-(uint)(fVar75 < fVar67) & 0x3f800000);
                fVar77 = fVar77 - (float)(-(uint)(fVar79 < fVar77) & 0x3f800000);
                fVar53 = fVar53 - (float)(-(uint)(fVar64 < fVar53) & 0x3f800000);
                fVar65 = fVar65 - (float)(-(uint)(fVar66 < fVar65) & 0x3f800000);
                fVar75 = fVar67 * -0.6931472 + auVar42._0_4_;
                fVar79 = fVar77 * -0.6931472 + auVar42._4_4_;
                fVar64 = fVar53 * -0.6931472 + auVar42._8_4_;
                fVar66 = fVar65 * -0.6931472 + auVar42._12_4_;
                auVar74._0_4_ = fVar75 * fVar75;
                auVar74._4_4_ = fVar79 * fVar79;
                auVar74._8_4_ = fVar64 * fVar64;
                auVar74._12_4_ = fVar66 * fVar66;
                auVar63._0_4_ =
                     (float)((int)fVar67 * 0x800000 + 0x3f800000) *
                     (fVar75 + 1.0 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * auVar74._0_4_) + 1.0;
                auVar63._4_4_ =
                     (float)((int)fVar77 * 0x800000 + 0x3f800000) *
                     (fVar79 + 1.0 +
                     (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                       0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * auVar74._4_4_) + 1.0;
                auVar63._8_4_ =
                     (float)((int)fVar53 * 0x800000 + 0x3f800000) *
                     (fVar64 + 1.0 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * auVar74._8_4_) + 1.0;
                auVar63._12_4_ =
                     (float)((int)fVar65 * 0x800000 + 0x3f800000) *
                     (fVar66 + 1.0 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * auVar74._12_4_) + 1.0;
                auVar42 = rcpps(auVar74,auVar63);
                fVar67 = auVar42._0_4_;
                fVar75 = auVar42._4_4_;
                fVar77 = auVar42._8_4_;
                fVar79 = auVar42._12_4_;
                auVar47._0_4_ = (1.0 - auVar63._0_4_ * fVar67) * fVar67 + fVar67;
                auVar47._4_4_ = (1.0 - auVar63._4_4_ * fVar75) * fVar75 + fVar75;
                auVar47._8_4_ = (1.0 - auVar63._8_4_ * fVar77) * fVar77 + fVar77;
                auVar47._12_4_ = (1.0 - auVar63._12_4_ * fVar79) * fVar79 + fVar79;
                break;
              case 5:
                auVar42 = minps(_local_138,_DAT_002da3c0);
                auVar42 = maxps(auVar42,_DAT_002da3d0);
                fVar53 = auVar42._0_4_ * 1.442695 + 0.5;
                fVar64 = auVar42._4_4_ * 1.442695 + 0.5;
                fVar65 = auVar42._8_4_ * 1.442695 + 0.5;
                fVar66 = auVar42._12_4_ * 1.442695 + 0.5;
                fVar68 = (float)(int)fVar53;
                fVar76 = (float)(int)fVar64;
                fVar78 = (float)(int)fVar65;
                fVar80 = (float)(int)fVar66;
                fVar68 = fVar68 - (float)(-(uint)(fVar53 < fVar68) & 0x3f800000);
                fVar76 = fVar76 - (float)(-(uint)(fVar64 < fVar76) & 0x3f800000);
                fVar78 = fVar78 - (float)(-(uint)(fVar65 < fVar78) & 0x3f800000);
                fVar80 = fVar80 - (float)(-(uint)(fVar66 < fVar80) & 0x3f800000);
                fVar53 = auVar42._0_4_ - fVar68 * 0.6931472;
                fVar64 = auVar42._4_4_ - fVar76 * 0.6931472;
                fVar65 = auVar42._8_4_ - fVar78 * 0.6931472;
                fVar66 = auVar42._12_4_ - fVar80 * 0.6931472;
                auVar59._0_4_ =
                     (float)((int)fVar68 * 0x800000 + 0x3f800000) *
                     (fVar53 + 1.0 +
                     (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                       0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) * fVar53 * fVar53) + 1.0;
                auVar59._4_4_ =
                     (float)((int)fVar76 * 0x800000 + 0x3f800000) *
                     (fVar64 + 1.0 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64) + 1.0;
                auVar59._8_4_ =
                     (float)((int)fVar78 * 0x800000 + 0x3f800000) *
                     (fVar65 + 1.0 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65) + 1.0;
                auVar59._12_4_ =
                     (float)((int)fVar80 * 0x800000 + 0x3f800000) *
                     (fVar66 + 1.0 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) + 1.0;
                auVar42 = maxps(auVar59,_DAT_002da460);
                fVar53 = (float)(auVar42._0_4_ & 0x807fffff | 0x3f000000);
                fVar65 = (float)(auVar42._4_4_ & 0x807fffff | 0x3f000000);
                fVar68 = (float)(auVar42._8_4_ & 0x807fffff | 0x3f000000);
                fVar78 = (float)(auVar42._12_4_ & 0x807fffff | 0x3f000000);
                fVar64 = fVar53 + -1.0 + (float)(-(uint)(fVar53 < 0.70710677) & (uint)fVar53);
                fVar66 = fVar65 + -1.0 + (float)(-(uint)(fVar65 < 0.70710677) & (uint)fVar65);
                fVar76 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
                fVar80 = fVar78 + -1.0 + (float)(-(uint)(fVar78 < 0.70710677) & (uint)fVar78);
                auVar60._0_4_ =
                     ~-(uint)(auVar59._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar53 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar64 + (((((((((fVar64 * 0.070376836 + -0.1151461) * fVar64 +
                                             0.116769984) * fVar64 + -0.12420141) * fVar64 +
                                           0.14249323) * fVar64 + -0.16668057) * fVar64 + 0.20000714
                                         ) * fVar64 + -0.24999994) * fVar64 + 0.3333333) * fVar64 +
                                      -0.5) * fVar64 * fVar64) * -2.0);
                auVar60._4_4_ =
                     ~-(uint)(auVar59._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar65 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar66 + (((((((((fVar66 * 0.070376836 + -0.1151461) * fVar66 +
                                             0.116769984) * fVar66 + -0.12420141) * fVar66 +
                                           0.14249323) * fVar66 + -0.16668057) * fVar66 + 0.20000714
                                         ) * fVar66 + -0.24999994) * fVar66 + 0.3333333) * fVar66 +
                                      -0.5) * fVar66 * fVar66) * -2.0);
                auVar60._8_4_ =
                     ~-(uint)(auVar59._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar68 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar76 + (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 +
                                             0.116769984) * fVar76 + -0.12420141) * fVar76 +
                                           0.14249323) * fVar76 + -0.16668057) * fVar76 + 0.20000714
                                         ) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 +
                                      -0.5) * fVar76 * fVar76) * -2.0);
                auVar60._12_4_ =
                     ~-(uint)(auVar59._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar42._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar78 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar80 + (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                             0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                           0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714
                                         ) * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 +
                                      -0.5) * fVar80 * fVar80) * -2.0);
                auVar49._0_8_ =
                     CONCAT44(-(uint)(auVar59._4_4_ <= 0.0),-(uint)(auVar59._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar49._8_4_ = -(uint)(auVar59._8_4_ <= 0.0) & 0x7fffffff;
                auVar49._12_4_ = -(uint)(auVar59._12_4_ <= 0.0) & 0x7fffffff;
                auVar42 = minps(auVar49 | auVar60,_DAT_002da3c0);
                auVar42 = maxps(auVar42,_DAT_002da3d0);
                fVar53 = auVar42._0_4_ * 1.442695 + 0.5;
                fVar64 = auVar42._4_4_ * 1.442695 + 0.5;
                fVar65 = auVar42._8_4_ * 1.442695 + 0.5;
                fVar66 = auVar42._12_4_ * 1.442695 + 0.5;
                fVar68 = (float)(int)fVar53;
                fVar76 = (float)(int)fVar64;
                fVar78 = (float)(int)fVar65;
                fVar80 = (float)(int)fVar66;
                fVar68 = fVar68 - (float)(-(uint)(fVar53 < fVar68) & 0x3f800000);
                fVar76 = fVar76 - (float)(-(uint)(fVar64 < fVar76) & 0x3f800000);
                fVar78 = fVar78 - (float)(-(uint)(fVar65 < fVar78) & 0x3f800000);
                fVar80 = fVar80 - (float)(-(uint)(fVar66 < fVar80) & 0x3f800000);
                fVar53 = auVar42._0_4_ - fVar68 * 0.6931472;
                fVar64 = auVar42._4_4_ - fVar76 * 0.6931472;
                fVar65 = auVar42._8_4_ - fVar78 * 0.6931472;
                fVar66 = auVar42._12_4_ - fVar80 * 0.6931472;
                auVar61._0_4_ = fVar53 * fVar53;
                auVar61._4_4_ = fVar64 * fVar64;
                auVar61._8_4_ = fVar65 * fVar65;
                auVar61._12_4_ = fVar66 * fVar66;
                auVar72._0_4_ =
                     (float)((int)fVar68 * 0x800000 + 0x3f800000) *
                     (fVar53 + 1.0 +
                     (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                       0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) * auVar61._0_4_) + 1.0;
                auVar72._4_4_ =
                     (float)((int)fVar76 * 0x800000 + 0x3f800000) *
                     (fVar64 + 1.0 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * auVar61._4_4_) + 1.0;
                auVar72._8_4_ =
                     (float)((int)fVar78 * 0x800000 + 0x3f800000) *
                     (fVar65 + 1.0 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * auVar61._8_4_) + 1.0;
                auVar72._12_4_ =
                     (float)((int)fVar80 * 0x800000 + 0x3f800000) *
                     (fVar66 + 1.0 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * auVar61._12_4_) + 1.0;
                auVar42 = rcpps(auVar61,auVar72);
                fVar53 = auVar42._0_4_;
                fVar64 = auVar42._4_4_;
                fVar65 = auVar42._8_4_;
                fVar66 = auVar42._12_4_;
                auVar47._0_4_ =
                     (fVar53 + fVar53 + -1.0 + (2.0 - auVar72._0_4_ * (fVar53 + fVar53)) * fVar53) *
                     fVar67;
                auVar47._4_4_ =
                     (fVar64 + fVar64 + -1.0 + (2.0 - auVar72._4_4_ * (fVar64 + fVar64)) * fVar64) *
                     fVar75;
                auVar47._8_4_ =
                     (fVar65 + fVar65 + -1.0 + (2.0 - auVar72._8_4_ * (fVar65 + fVar65)) * fVar65) *
                     fVar77;
                auVar47._12_4_ =
                     (fVar66 + fVar66 + -1.0 + (2.0 - auVar72._12_4_ * (fVar66 + fVar66)) * fVar66)
                     * fVar79;
                break;
              case 6:
                fVar53 = **(float **)(&this->field_0xf8 + (long)p_Var9);
                fVar64 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
                auVar51._0_4_ = fVar53 * fVar67 + fVar64;
                auVar51._4_4_ = fVar53 * fVar75 + fVar64;
                auVar51._8_4_ = fVar53 * fVar77 + fVar64;
                auVar51._12_4_ = fVar53 * fVar79 + fVar64;
                auVar42 = maxps(auVar51,ZEXT816(0));
                auVar42 = minps(auVar42,_DAT_002da3b0);
                auVar47._0_4_ = auVar42._0_4_ * fVar67;
                auVar47._4_4_ = auVar42._4_4_ * fVar75;
                auVar47._8_4_ = auVar42._8_4_ * fVar77;
                auVar47._12_4_ = auVar42._12_4_ * fVar79;
              }
            }
            *pauVar30 = auVar47;
            pauVar30 = pauVar30 + 1;
          }
        }
      }
      if ((iVar7 == 4) && (bVar29 != 0)) {
        uVar38 = 0;
        if (0 < iVar26) {
          uVar38 = (ulong)(uint)iVar26;
        }
        uVar28 = 0;
        if (0 < iVar31) {
          uVar28 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar28; uVar32 = uVar32 + 1) {
          iVar35 = top_blob->w;
          sVar10 = top_blob->elemsize;
          pvVar11 = top_blob->data;
          for (lVar39 = 0; lVar39 <= iVar8; lVar39 = lVar39 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86[-3]) == 0) {
              auVar41 = ZEXT812(0);
            }
            else {
              auVar41._4_8_ = 0;
              auVar41._0_4_ =
                   *(uint *)(*(long *)(&this->field_0x190 + (long)this->_vptr_Convolution1D_x86[-3])
                            + uVar32 * 4);
            }
            uStack_130._4_4_ = 0.0;
            _local_138 = auVar41;
            Mat::channel(&local_78,&this->weight_data_packed,(int)uVar32);
            pfVar33 = (float *)local_78.data;
            Mat::~Mat(&local_78);
            for (uVar34 = 0; uVar34 != uVar38; uVar34 = uVar34 + 1) {
              p_Var9 = this->_vptr_Convolution1D_x86[-3];
              pfVar36 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * (int)lVar39 * 4
                                       ) * 4 +
                                 (long)bottom_blob_bordered.w *
                                 CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                          (undefined4)bottom_blob_bordered.elemsize) * uVar34);
              iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var9);
              if (iVar37 < 1) {
                iVar37 = 0;
              }
              while (bVar40 = iVar37 != 0, iVar37 = iVar37 + -1, bVar40) {
                local_138._0_4_ =
                     local_138._0_4_ + pfVar33[2] * pfVar36[2] + *pfVar33 * *pfVar36 +
                     pfVar33[3] * pfVar36[3] + pfVar33[1] * pfVar36[1];
                pfVar36 = pfVar36 + (long)*(int *)(&this->field_0xd8 + (long)p_Var9) * 4;
                pfVar33 = pfVar33 + 4;
              }
            }
            p_Var9 = this->_vptr_Convolution1D_x86[-3];
            auVar52 = _local_138;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var9)) {
            case 1:
              if ((float)local_138._0_4_ <= 0.0) {
                auVar13._12_4_ = 0;
                auVar13._0_12_ = register0x00001204;
                auVar52 = auVar13 << 0x20;
              }
              break;
            case 2:
              auVar52 = ZEXT416((uint)((float)(-(uint)(0.0 < (float)local_138._0_4_) & 0x3f800000 |
                                              ~-(uint)(0.0 < (float)local_138._0_4_) &
                                              **(uint **)(&this->field_0xf8 + (long)p_Var9)) *
                                      (float)local_138._0_4_));
              break;
            case 3:
              fVar67 = **(float **)(&this->field_0xf8 + (long)p_Var9);
              if ((float)local_138._0_4_ <= fVar67) {
                local_138._0_4_ = fVar67;
              }
              fVar67 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
              auVar52 = _local_138;
              if (fVar67 <= local_138._0_4_) {
                auVar52._4_12_ = local_138._4_12_;
                auVar52._0_4_ = fVar67;
              }
              break;
            case 4:
              fVar67 = expf(-(float)local_138._0_4_);
              auVar52 = ZEXT416((uint)(1.0 / (fVar67 + 1.0)));
              break;
            case 5:
              fVar67 = expf((float)local_138._0_4_);
              fVar67 = logf(fVar67 + 1.0);
              fVar67 = tanhf(fVar67);
              auVar52._0_4_ = fVar67 * (float)local_138._0_4_;
              auVar52._4_12_ = extraout_var;
              break;
            case 6:
              fVar67 = **(float **)(&this->field_0xf8 + (long)p_Var9);
              fVar75 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
              fVar77 = -fVar75 / fVar67;
              auVar52 = ZEXT816(0);
              if ((fVar77 <= (float)local_138._0_4_) &&
                 (auVar52 = _local_138, (float)local_138._0_4_ <= fVar77 + 1.0 / fVar67)) {
                auVar52 = ZEXT416((uint)((fVar67 * (float)local_138._0_4_ + fVar75) *
                                        (float)local_138._0_4_));
              }
            }
            *(int *)((long)pvVar11 + lVar39 * 4 + (long)iVar35 * uVar32 * sVar10) = auVar52._0_4_;
          }
        }
      }
      local_e0 = 0;
      if (bVar29 == 1 && iVar7 == 1) {
        pvVar11 = top_blob->data;
        iVar7 = top_blob->w;
        sVar10 = top_blob->elemsize;
        uVar38 = 0;
        if (0 < iVar26) {
          uVar38 = (ulong)(uint)iVar26;
        }
        local_e0 = 0;
        if (iVar31 < 1) {
          uVar27 = 0;
        }
        for (uVar28 = 0; uVar28 != uVar27; uVar28 = uVar28 + 1) {
          pp_Var12 = this->_vptr_Convolution1D_x86;
          for (lVar39 = 0; lVar39 <= iVar8; lVar39 = lVar39 + 1) {
            p_Var9 = pp_Var12[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var9) == 0) {
              fVar67 = 0.0;
            }
            else {
              fVar67 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var9) + uVar28 * 4);
            }
            iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var9);
            pfVar33 = (float *)((long)(iVar26 * (int)uVar28 * iVar31) * 4 +
                               *(long *)(&this->field_0x148 + (long)p_Var9));
            if (iVar31 < 1) {
              iVar31 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar38; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)((long)bottom_blob_bordered.data +
                                 (long)*(int *)(&this->field_0xdc + (long)p_Var9) *
                                 (long)(int)lVar39 * 4 +
                                 (long)bottom_blob_bordered.w *
                                 CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                          (undefined4)bottom_blob_bordered.elemsize) * uVar32);
              iVar35 = iVar31;
              while (bVar40 = iVar35 != 0, iVar35 = iVar35 + -1, bVar40) {
                fVar67 = fVar67 + *pfVar33 * *pfVar36;
                pfVar36 = pfVar36 + *(int *)(&this->field_0xd8 + (long)p_Var9);
                pfVar33 = pfVar33 + 1;
              }
            }
            fVar75 = fVar67;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var9)) {
            case 1:
              if (fVar67 <= 0.0) {
                fVar75 = 0.0;
              }
              break;
            case 2:
              fVar75 = (float)(-(uint)(0.0 < fVar67) & 0x3f800000 |
                              ~-(uint)(0.0 < fVar67) & **(uint **)(&this->field_0xf8 + (long)p_Var9)
                              ) * fVar67;
              break;
            case 3:
              fVar75 = **(float **)(&this->field_0xf8 + (long)p_Var9);
              if (fVar67 <= fVar75) {
                fVar67 = fVar75;
              }
              fVar77 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
              fVar75 = fVar67;
              if (fVar77 <= fVar67) {
                fVar75 = fVar77;
              }
              break;
            case 4:
              fVar67 = expf(-fVar67);
              fVar75 = 1.0 / (fVar67 + 1.0);
              break;
            case 5:
              fVar75 = expf(fVar67);
              fVar75 = logf(fVar75 + 1.0);
              fVar75 = tanhf(fVar75);
              fVar75 = fVar75 * fVar67;
              break;
            case 6:
              fVar77 = **(float **)(&this->field_0xf8 + (long)p_Var9);
              fVar79 = (*(float **)(&this->field_0xf8 + (long)p_Var9))[1];
              fVar53 = -fVar79 / fVar77;
              fVar75 = 0.0;
              if ((fVar53 <= fVar67) && (fVar75 = fVar67, fVar67 <= fVar53 + 1.0 / fVar77)) {
                fVar75 = (fVar77 * fVar67 + fVar79) * fVar67;
              }
            }
            *(float *)((long)pvVar11 + lVar39 * 4 + (long)iVar7 * sVar10 * uVar28) = fVar75;
          }
        }
      }
    }
  }
  Mat::~Mat(&bottom_blob_bordered);
  return local_e0;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}